

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# plannerbase.cpp
# Opt level: O2

void __thiscall
despot::PlannerBase::InitializeLogger
          (PlannerBase *this,Logger **logger,Option *options,DSPOMDP *model,Belief *belief,
          Solver *solver,int num_runs,clock_t main_clock_start,World *world,string world_type,
          int time_limit,string solver_type)

{
  Logger *this_00;
  string *world_type_00;
  string local_70;
  string local_50;
  
  this_00 = (Logger *)operator_new(0xb0);
  if ((int)world_type._M_string_length == -1) {
    world_type_00 = &local_70;
    std::__cxx11::string::string((string *)world_type_00,(string *)world_type._M_dataplus._M_p);
    Logger::Logger(this_00,model,belief,solver,world,world_type_00,main_clock_start,
                   (ostream *)&std::cout,-1.0,-1);
  }
  else {
    world_type_00 = &local_50;
    std::__cxx11::string::string((string *)world_type_00,(string *)world_type._M_dataplus._M_p);
    Logger::Logger(this_00,model,belief,solver,world,world_type_00,main_clock_start,
                   (ostream *)&std::cout,
                   (double)(int)world_type._M_string_length + EvalLog::curr_inst_start_time,
                   num_runs * DAT_0019fdc8);
  }
  *logger = this_00;
  std::__cxx11::string::~string((string *)world_type_00);
  return;
}

Assistant:

void PlannerBase::InitializeLogger(Logger *&logger,
		option::Option *options, DSPOMDP *model, Belief* belief, Solver *solver,
		int num_runs, clock_t main_clock_start, World* world, string world_type,
		int time_limit, string solver_type) {

	if (time_limit != -1) {
		logger = new Logger(model, belief, solver, world, world_type,
				main_clock_start, &cout,
				EvalLog::curr_inst_start_time + time_limit,
				num_runs * Globals::config.sim_len);
	} else {
		logger = new Logger(model, belief, solver, world, world_type,
				main_clock_start, &cout);
	}
}